

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxpmhandler.cpp
# Opt level: O2

bool read_xpm_header(QIODevice *device,char **source,int *index,QByteArray *state,int *cpp,
                    int *ncols,int *w,int *h)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  long in_FS_OFFSET;
  bool bVar4;
  QArrayDataPointer<char> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = &DAT_aaaaaaaaaaaaaaaa;
  bVar4 = false;
  QByteArray::QByteArray((QByteArray *)&local_58,200,'\0');
  bVar1 = read_xpm_string((QByteArray *)&local_58,device,source,index,state);
  if (bVar1) {
    pcVar3 = local_58.ptr;
    if (local_58.ptr == (char *)0x0) {
      pcVar3 = (char *)&QByteArray::_empty;
    }
    bVar4 = false;
    iVar2 = __isoc99_sscanf(pcVar3,"%d %d %d %d",w,h,ncols,cpp);
    if (3 < iVar2) {
      if (((*w - 0x8000U < 0xffff8001) || (*h - 0x8000U < 0xffff8001)) ||
         (*ncols + 0xfeffffffU < 0xff000000)) {
        bVar4 = false;
      }
      else {
        bVar4 = *cpp - 1U < 0xf;
      }
    }
  }
  QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

static bool read_xpm_header(
    QIODevice *device, const char * const * source, int& index, QByteArray &state,
    int *cpp, int *ncols, int *w, int *h)
{
    QByteArray buf(200, 0);

    if (!read_xpm_string(buf, device, source, index, state))
        return false;

#ifdef Q_CC_MSVC
        if (sscanf_s(buf, "%d %d %d %d", w, h, ncols, cpp) < 4)
#else
    if (sscanf(buf, "%d %d %d %d", w, h, ncols, cpp) < 4)
#endif
        return false;                                        // < 4 numbers parsed

    if (*w <= 0 || *w > 32767 || *h <= 0 || *h > 32767 || *ncols <= 0 || *ncols > (64 * 64 * 64 * 64) || *cpp <= 0 || *cpp > 15)
        return false;                                        // failed sanity check

    return true;
}